

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

wstring * __thiscall
mjs::parser::get_identifier_name_abi_cxx11_
          (wstring *__return_storage_ptr__,parser *this,char *func,int line)

{
  token_type tVar1;
  ostream *poVar2;
  runtime_error *this_00;
  undefined4 in_register_0000000c;
  token_type t;
  ostringstream oss;
  string asStack_1e8 [32];
  token local_1c8;
  undefined1 local_1a0 [376];
  
  accept((parser *)local_1a0,(int)this,(sockaddr *)0x2,
         (socklen_t *)CONCAT44(in_register_0000000c,line));
  if ((local_1a0._0_4_ == identifier) || (local_1a0._0_4_ == string_literal)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)__return_storage_ptr__,local_1a0._8_8_,
               local_1a0._8_8_ + local_1a0._16_8_ * 4);
  }
  else {
    if (local_1a0._0_4_ != eof) {
      __assert_fail("has_text()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",
                    0xd6,"const std::wstring &mjs::token::text() const");
    }
    if (((int)this->version_ < 2) ||
       (tVar1 = (this->current_token_).type_, 0x3c < tVar1 - abstract_)) {
      token::destroy((token *)local_1a0);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Expected identifier name in ",0x1c);
      poVar2 = std::operator<<((ostream *)local_1a0,func);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," line ",6);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,line);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," got ",5);
      mjs::operator<<(poVar2,&this->current_token_);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,asStack_1e8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    get_token(&local_1c8,this);
    token::destroy(&local_1c8);
    token_string_abi_cxx11_(__return_storage_ptr__,(mjs *)(ulong)tVar1,t);
  }
  token::destroy((token *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::wstring parser::get_identifier_name(const char* func, int line) {
    if (auto id = accept(token_type::identifier)) {
        return id.text();
    } else if (version_ >= version::es5) {
        // In ES5+ IdentifierName is used in various grammars
        // This means reserved words can be used as identifiers in certain contexts (e.g. Left-Hand-Side and Object Initialiser Expressions)
        switch (const auto t = current_token_type()) {
#define CASE_KEYWORD(tt, ...) case token_type::tt##_:
            MJS_KEYWORDS(CASE_KEYWORD);
#undef CASE_KEYWORD
            {
                get_token(); // Advance to next token
                return token_string(t);
            }
        default:
            break;
        }
    }

    std::ostringstream oss;
    oss << "Expected identifier name in " << func << " line " << line << " got " << current_token();
    throw std::runtime_error(oss.str());
}